

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  ArrayIndex i;
  ArrayIndex AVar2;
  String local_1c0;
  OStringStream oss;
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)&oss,arrayValue);
    swap((Value *)&oss,this);
    ~Value((Value *)&oss);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1c0);
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else if (AVar1 < newSize) {
    for (; AVar1 < newSize; AVar1 = AVar1 + 1) {
      operator[](this,AVar1);
    }
  }
  else {
    for (AVar2 = newSize; AVar1 != AVar2; AVar2 = AVar2 + 1) {
      _oss = 0;
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::erase(&((this->value_).map_)->_M_t,(CZString *)&oss);
      CZString::~CZString((CZString *)&oss);
    }
    AVar1 = size(this);
    if (AVar1 != newSize) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&oss,"assert json failed",(allocator<char> *)&local_1c0);
      throwLogicError((String *)&oss);
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    for (ArrayIndex i = oldSize; i < newSize; ++i)
      (*this)[i];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}